

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

int Kit_TruthCountMinterms(uint *pTruth,int nVars,int *pRes,int *pBytesInit)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  long lVar8;
  uint *puVar9;
  uint *puVar10;
  long lVar11;
  
  if (0x14 < nVars) {
    __assert_fail("nVars <= 20",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitTruth.c"
                  ,0x759,"int Kit_TruthCountMinterms(unsigned int *, int, int *, int *)");
  }
  iVar5 = 0;
  memset(pRes,0,(long)nVars << 2);
  uVar2 = (ulong)(uint)(4 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar2 = 4;
  }
  puVar7 = pTruth;
  puVar9 = (uint *)pBytesInit;
  do {
    uVar3 = 0;
    puVar10 = puVar9;
    while( true ) {
      puVar9 = puVar10 + 1;
      uVar3 = uVar3 + Kit_TruthCountMinterms::Table[(byte)*puVar7];
      *puVar10 = Kit_TruthCountMinterms::Table[(byte)*puVar7] & 0xff;
      if (0xf6 < (uVar3 & 0xff)) break;
      puVar7 = (uint *)((long)puVar7 + 1);
      puVar10 = puVar9;
      if ((uint *)((long)pTruth + uVar2) <= puVar7) {
        if (uVar3 != 0) {
          *pRes = *pRes + (uVar3 >> 8 & 0xff);
          iVar5 = iVar5 + (uVar3 & 0xff);
          pRes[1] = pRes[1] + (uVar3 >> 0x10 & 0xff);
          pRes[2] = pRes[2] + (uVar3 >> 0x18);
        }
        goto LAB_00545a00;
      }
    }
    *pRes = *pRes + (uVar3 >> 8 & 0xff);
    pRes[2] = pRes[2] + (uVar3 >> 0x10 & 0xff);
    pRes[3] = pRes[3] + (uVar3 >> 0x18);
    iVar5 = iVar5 + (uVar3 & 0xff);
    puVar7 = (uint *)((long)puVar7 + 1);
    if ((uint *)((long)pTruth + uVar2) <= puVar7) {
LAB_00545a00:
      iVar6 = 1;
      lVar4 = 3;
      do {
        lVar8 = (long)iVar6;
        iVar6 = iVar6 * 2;
        lVar11 = 0;
        do {
          pRes[lVar4] = pRes[lVar4] + pBytesInit[lVar11];
          pBytesInit[lVar11] = pBytesInit[lVar11] + pBytesInit[lVar8 + lVar11];
          lVar11 = lVar11 + iVar6;
        } while (lVar11 < (long)uVar2);
        lVar4 = lVar4 + 1;
      } while (iVar6 < (int)uVar2);
      if (*pBytesInit != iVar5) {
        __assert_fail("pBytesInit[0] == nTotal",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitTruth.c"
                      ,0x780,"int Kit_TruthCountMinterms(unsigned int *, int, int *, int *)");
      }
      if ((int)lVar4 != nVars) {
        __assert_fail("iVar == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitTruth.c"
                      ,0x781,"int Kit_TruthCountMinterms(unsigned int *, int, int *, int *)");
      }
      if (0 < nVars) {
        uVar2 = 0;
        do {
          iVar6 = pRes[uVar2];
          iVar1 = Kit_TruthCofactor0Count(pTruth,nVars,(int)uVar2);
          if (iVar6 != iVar1) {
            __assert_fail("pRes[i] == Kit_TruthCofactor0Count(pTruth, nVars, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitTruth.c"
                          ,0x784,"int Kit_TruthCountMinterms(unsigned int *, int, int *, int *)");
          }
          uVar2 = uVar2 + 1;
        } while ((uint)nVars != uVar2);
      }
      return iVar5;
    }
  } while( true );
}

Assistant:

int Kit_TruthCountMinterms( unsigned * pTruth, int nVars, int * pRes, int * pBytesInit )
{
    // the number of 1s if every byte as well as in the 0-cofactors w.r.t. three variables
    static unsigned Table[256] = {
        0x00000000, 0x01010101, 0x01010001, 0x02020102, 0x01000101, 0x02010202, 0x02010102, 0x03020203,
        0x01000001, 0x02010102, 0x02010002, 0x03020103, 0x02000102, 0x03010203, 0x03010103, 0x04020204,
        0x00010101, 0x01020202, 0x01020102, 0x02030203, 0x01010202, 0x02020303, 0x02020203, 0x03030304,
        0x01010102, 0x02020203, 0x02020103, 0x03030204, 0x02010203, 0x03020304, 0x03020204, 0x04030305,
        0x00010001, 0x01020102, 0x01020002, 0x02030103, 0x01010102, 0x02020203, 0x02020103, 0x03030204,
        0x01010002, 0x02020103, 0x02020003, 0x03030104, 0x02010103, 0x03020204, 0x03020104, 0x04030205,
        0x00020102, 0x01030203, 0x01030103, 0x02040204, 0x01020203, 0x02030304, 0x02030204, 0x03040305,
        0x01020103, 0x02030204, 0x02030104, 0x03040205, 0x02020204, 0x03030305, 0x03030205, 0x04040306,
        0x00000101, 0x01010202, 0x01010102, 0x02020203, 0x01000202, 0x02010303, 0x02010203, 0x03020304,
        0x01000102, 0x02010203, 0x02010103, 0x03020204, 0x02000203, 0x03010304, 0x03010204, 0x04020305,
        0x00010202, 0x01020303, 0x01020203, 0x02030304, 0x01010303, 0x02020404, 0x02020304, 0x03030405,
        0x01010203, 0x02020304, 0x02020204, 0x03030305, 0x02010304, 0x03020405, 0x03020305, 0x04030406,
        0x00010102, 0x01020203, 0x01020103, 0x02030204, 0x01010203, 0x02020304, 0x02020204, 0x03030305,
        0x01010103, 0x02020204, 0x02020104, 0x03030205, 0x02010204, 0x03020305, 0x03020205, 0x04030306,
        0x00020203, 0x01030304, 0x01030204, 0x02040305, 0x01020304, 0x02030405, 0x02030305, 0x03040406,
        0x01020204, 0x02030305, 0x02030205, 0x03040306, 0x02020305, 0x03030406, 0x03030306, 0x04040407,
        0x00000001, 0x01010102, 0x01010002, 0x02020103, 0x01000102, 0x02010203, 0x02010103, 0x03020204,
        0x01000002, 0x02010103, 0x02010003, 0x03020104, 0x02000103, 0x03010204, 0x03010104, 0x04020205,
        0x00010102, 0x01020203, 0x01020103, 0x02030204, 0x01010203, 0x02020304, 0x02020204, 0x03030305,
        0x01010103, 0x02020204, 0x02020104, 0x03030205, 0x02010204, 0x03020305, 0x03020205, 0x04030306,
        0x00010002, 0x01020103, 0x01020003, 0x02030104, 0x01010103, 0x02020204, 0x02020104, 0x03030205,
        0x01010003, 0x02020104, 0x02020004, 0x03030105, 0x02010104, 0x03020205, 0x03020105, 0x04030206,
        0x00020103, 0x01030204, 0x01030104, 0x02040205, 0x01020204, 0x02030305, 0x02030205, 0x03040306,
        0x01020104, 0x02030205, 0x02030105, 0x03040206, 0x02020205, 0x03030306, 0x03030206, 0x04040307,
        0x00000102, 0x01010203, 0x01010103, 0x02020204, 0x01000203, 0x02010304, 0x02010204, 0x03020305,
        0x01000103, 0x02010204, 0x02010104, 0x03020205, 0x02000204, 0x03010305, 0x03010205, 0x04020306,
        0x00010203, 0x01020304, 0x01020204, 0x02030305, 0x01010304, 0x02020405, 0x02020305, 0x03030406,
        0x01010204, 0x02020305, 0x02020205, 0x03030306, 0x02010305, 0x03020406, 0x03020306, 0x04030407,
        0x00010103, 0x01020204, 0x01020104, 0x02030205, 0x01010204, 0x02020305, 0x02020205, 0x03030306,
        0x01010104, 0x02020205, 0x02020105, 0x03030206, 0x02010205, 0x03020306, 0x03020206, 0x04030307,
        0x00020204, 0x01030305, 0x01030205, 0x02040306, 0x01020305, 0x02030406, 0x02030306, 0x03040407,
        0x01020205, 0x02030306, 0x02030206, 0x03040307, 0x02020306, 0x03030407, 0x03030307, 0x04040408
    };
    unsigned uSum;
    unsigned char * pTruthC, * pLimit;
    int * pBytes = pBytesInit;
    int i, iVar, Step, nWords, nBytes, nTotal;

    assert( nVars <= 20 );

    // clear storage
    memset( pRes, 0, sizeof(int) * nVars );

    // count the number of one's in 0-cofactors of the first three variables
    nTotal = uSum = 0;
    nWords = Kit_TruthWordNum( nVars );
    nBytes = nWords * 4;
    pTruthC = (unsigned char *)pTruth;
    pLimit = pTruthC + nBytes;
    for ( ; pTruthC < pLimit; pTruthC++ )
    {
        uSum += Table[*pTruthC];
        *pBytes++ = (Table[*pTruthC] & 0xff);
        if ( (uSum & 0xff) > 246 )
        {
            nTotal += (uSum & 0xff);
            pRes[0] += ((uSum >>  8) & 0xff);
            pRes[2] += ((uSum >> 16) & 0xff);
            pRes[3] += ((uSum >> 24) & 0xff);
            uSum = 0;
        }
    }
    if ( uSum )
    {
        nTotal += (uSum & 0xff);
        pRes[0] += ((uSum >>  8) & 0xff);
        pRes[1] += ((uSum >> 16) & 0xff);
        pRes[2] += ((uSum >> 24) & 0xff);
    }

    // count all other variables
    for ( iVar = 3, Step = 1; Step < nBytes; Step *= 2, iVar++ )
        for ( i = 0; i < nBytes; i += Step + Step )
        {
            pRes[iVar] += pBytesInit[i];
            pBytesInit[i] += pBytesInit[i+Step];
        }
    assert( pBytesInit[0] == nTotal );
    assert( iVar == nVars );

    for ( i = 0; i < nVars; i++ )
        assert( pRes[i] == Kit_TruthCofactor0Count(pTruth, nVars, i) );
    return nTotal;
}